

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThread.cpp
# Opt level: O3

Value __thiscall xmrig::CpuThread::toJSON(CpuThread *this,Document *doc)

{
  uint uVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  ulong uVar2;
  undefined2 uVar3;
  ulong in_RDX;
  ulong extraout_RDX;
  Value VVar5;
  Data local_28;
  ulong uVar4;
  
  uVar1 = *(uint *)((long)&(doc->
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ).data_ + 8);
  local_28._4_1_ = '\0';
  local_28._5_1_ = '\0';
  local_28._6_1_ = '\0';
  local_28._7_1_ = '\0';
  local_28._0_4_ = uVar1;
  if (local_28.n.i64 == (Number)0x0) {
    uVar2 = *(ulong *)&(doc->
                       super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ).data_;
    *(undefined8 *)&this->m_intensity = 0x96000000000000;
    this->m_affinity = uVar2;
    if ((long)uVar2 < 0) {
      uVar3 = 0xb6;
      if (uVar2 < 0xffffffff80000000) goto LAB_0015bdba;
    }
    else {
      in_RDX = (ulong)((uint)(uVar2 >> 0x20 == 0) << 6 | 0x196);
      uVar4 = 0x1f6;
      if ((uVar2 & 0xffffffff80000000) != 0) {
        uVar4 = in_RDX;
      }
      uVar3 = (undefined2)uVar4;
    }
    *(undefined2 *)&this->field_0xe = uVar3;
  }
  else {
    allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
    this->m_affinity = 0;
    *(undefined8 *)&this->m_intensity = 0;
    *(undefined2 *)&this->field_0xe = 4;
    local_28.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_28.s,allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)this,(doc->
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ).data_.n.i64,allocator);
    in_RDX = extraout_RDX;
  }
LAB_0015bdba:
  VVar5.data_.s.str = (Ch *)in_RDX;
  VVar5.data_.n = (Number)this;
  return (Value)VVar5.data_;
}

Assistant:

rapidjson::Value xmrig::CpuThread::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    if (m_intensity == 0) {
        return Value(m_affinity);
    }

    auto &allocator = doc.GetAllocator();

    Value out(kArrayType);
    out.PushBack(m_intensity, allocator);
    out.PushBack(m_affinity, allocator);

    return out;
}